

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setDecimalPatternMatchRequired(DecimalFormat *this,UBool newValue)

{
  DecimalFormatProperties *pDVar1;
  UBool newValue_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if ((int)newValue != (uint)(pDVar1->decimalPatternMatchRequired & 1)) {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->decimalPatternMatchRequired = newValue != '\0';
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setDecimalPatternMatchRequired(UBool newValue) {
    if (UBOOL_TO_BOOL(newValue) == fields->properties->decimalPatternMatchRequired) { return; }
    fields->properties->decimalPatternMatchRequired = newValue;
    touchNoError();
}